

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_server.c
# Opt level: O1

int append_to_requests(char *buffer,int new_socket)

{
  int iVar1;
  void *__dest;
  size_t __n;
  
  __dest = malloc(0x3f0);
  *(int *)((long)__dest + 1000) = new_socket;
  __n = strlen(buffer);
  memcpy(__dest,buffer,__n);
  iVar1 = array_list_add(reqs,__dest);
  *(int *)((long)__dest + 0x3ec) = iVar1;
  return iVar1;
}

Assistant:

int append_to_requests(char *buffer, int new_socket) {
    Request *new_req = (Request *) malloc(sizeof(Request));
    new_req->client_fd = new_socket;
    memcpy(new_req->request, buffer, strlen(buffer));
    int ind = array_list_add(reqs, new_req);
    new_req->id = ind;
    return ind;
}